

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btShapeHull.cpp
# Opt level: O0

void __thiscall btShapeHull::~btShapeHull(btShapeHull *this)

{
  btAlignedObjectArray<btVector3> *in_RDI;
  
  btAlignedObjectArray<unsigned_int>::clear((btAlignedObjectArray<unsigned_int> *)in_RDI);
  btAlignedObjectArray<btVector3>::clear(in_RDI);
  btAlignedObjectArray<unsigned_int>::~btAlignedObjectArray
            ((btAlignedObjectArray<unsigned_int> *)0x1c32d8);
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray
            ((btAlignedObjectArray<btVector3> *)0x1c32e2);
  return;
}

Assistant:

btShapeHull::~btShapeHull ()
{
	m_indices.clear();	
	m_vertices.clear ();
}